

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O2

void baryonyx::info<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
               (context *ctx,char *fmt,basic_string_view<char,_std::char_traits<char>_> *arg1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  
  if (5 < (int)ctx->log_priority) {
    log<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (_stdout,(FILE *)0x6,(int)fmt,(char *)arg1,
               (basic_string_view<char,_std::char_traits<char>_> *)args,in_R9);
    return;
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}